

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::ShaderAtomicExchangeCase::verify
          (ShaderAtomicExchangeCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  _Rb_tree_header *p_Var1;
  ostringstream *poVar2;
  int iVar3;
  _Rb_tree_color _Var4;
  _Base_ptr p_Var5;
  int iVar6;
  undefined8 extraout_RAX;
  _Base_ptr p_Var7;
  uint uVar8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  ulong uVar11;
  int outputValue;
  int in_stack_00000008;
  long in_stack_00000010;
  set<int,_std::less<int>,_std::allocator<int>_> usedValues;
  uint local_214;
  ulong local_210;
  int local_204;
  ShaderAtomicExchangeCase *local_200;
  ulong local_1f8;
  ulong local_1f0;
  size_t local_1e8;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_1e0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  local_204 = (int)tbs;
  uVar8 = (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[1] *
          (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[0] *
          (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[2];
  local_1f8 = (long)((ulong)(uint)((int)ctx >> 0x1f) << 0x20 | (ulong)ctx & 0xffffffff) /
              (long)(int)uVar8;
  local_1f0 = local_1f8 & 0xffffffff;
  if (0 < (int)local_1f8) {
    p_Var1 = &local_1e0._M_impl.super__Rb_tree_header;
    local_1f8 = local_1f8 & 0xffffffff;
    local_210 = 0;
    local_1f0 = 0;
    local_200 = this;
    local_1e8 = tbslen;
    do {
      iVar6 = (int)local_210;
      iVar3 = *(int *)(in_stack_00000010 + iVar6 * in_stack_00000008);
      local_1e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_1e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_1e0._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_1e0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      local_1e0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      if (0 < (int)uVar8) {
        uVar11 = 0;
        do {
          local_214 = *(uint *)(local_1e8 + (long)(int)((uVar8 * iVar6 + (int)uVar11) * local_204));
          if (uVar8 < local_214) {
LAB_0146df1a:
            local_1b0._0_8_ =
                 ((local_200->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode
                 .m_testCtx)->m_log;
            poVar2 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar2);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar2,"ERROR: at group ",0x10);
            std::ostream::operator<<(poVar2,(int)local_210);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar2,", invocation ",0xd);
            std::ostream::operator<<(poVar2,(int)uVar11);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar2,": found unexpected value ",0x19);
            std::ostream::operator<<(poVar2,local_214);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            goto LAB_0146dfa9;
          }
          p_Var5 = local_1e0._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var10 = &p_Var1->_M_header;
          if (local_1e0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
            do {
              p_Var9 = p_Var10;
              p_Var7 = p_Var5;
              _Var4 = p_Var7[1]._M_color;
              p_Var10 = p_Var7;
              if ((int)_Var4 < (int)local_214) {
                p_Var10 = p_Var9;
              }
              p_Var5 = (&p_Var7->_M_left)[(int)_Var4 < (int)local_214];
            } while ((&p_Var7->_M_left)[(int)_Var4 < (int)local_214] != (_Base_ptr)0x0);
            if ((_Rb_tree_header *)p_Var10 != p_Var1) {
              if ((int)_Var4 < (int)local_214) {
                p_Var7 = p_Var9;
              }
              if ((int)p_Var7[1]._M_color <= (int)local_214) goto LAB_0146df1a;
            }
          }
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &local_1e0,(int *)&local_214);
          uVar11 = uVar11 + 1;
        } while (uVar11 != uVar8);
      }
      uVar11 = local_210;
      if ((iVar3 < 0) || ((int)uVar8 < iVar3)) {
LAB_0146dfe8:
        local_1b0._0_8_ =
             ((local_200->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
        poVar2 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2,"ERROR: at group ",0x10);
        std::ostream::operator<<(poVar2,(int)uVar11);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2,": unexpected final value",0x18);
        std::ostream::operator<<(poVar2,iVar3);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_0146dfa9:
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
        std::ios_base::~ios_base(local_138);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree(&local_1e0);
        uVar8 = (uint)local_1f0;
        goto LAB_0146dfd4;
      }
      p_Var5 = local_1e0._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var10 = &p_Var1->_M_header;
      if (local_1e0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        do {
          p_Var9 = p_Var10;
          p_Var7 = p_Var5;
          _Var4 = p_Var7[1]._M_color;
          p_Var10 = p_Var7;
          if ((int)_Var4 < iVar3) {
            p_Var10 = p_Var9;
          }
          p_Var5 = (&p_Var7->_M_left)[(int)_Var4 < iVar3];
        } while ((&p_Var7->_M_left)[(int)_Var4 < iVar3] != (_Base_ptr)0x0);
        if ((_Rb_tree_header *)p_Var10 != p_Var1) {
          if ((int)_Var4 < iVar3) {
            p_Var7 = p_Var9;
          }
          if ((int)p_Var7[1]._M_color <= iVar3) goto LAB_0146dfe8;
        }
      }
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_1e0);
      local_210 = uVar11 + 1;
      local_1f0 = CONCAT71((int7)((ulong)extraout_RAX >> 8),local_1f8 <= local_210);
    } while (local_210 != local_1f8);
  }
  uVar8 = (uint)CONCAT71((int7)(local_1f0 >> 8),1);
LAB_0146dfd4:
  return uVar8 & 0xffffff01;
}

Assistant:

bool verify (int numValues, int inputStride, const void* inputs, int outputStride, const void* outputs, int groupStride, const void* groupOutputs) const
	{
		const int	workGroupSize	= (int)product(m_workGroupSize);
		const int	numWorkGroups	= numValues/workGroupSize;

		DE_UNREF(inputStride && inputs);

		for (int groupNdx = 0; groupNdx < numWorkGroups; groupNdx++)
		{
			const int	groupOffset		= groupNdx*workGroupSize;
			const int	groupOutput		= *(const deInt32*)((const deUint8*)groupOutputs + groupNdx*groupStride);
			set<int>	usedValues;

			for (int localNdx = 0; localNdx < workGroupSize; localNdx++)
			{
				const int outputValue = *(const deInt32*)((const deUint8*)outputs + outputStride*(groupOffset+localNdx));

				if (!de::inRange(outputValue, 0, workGroupSize) || usedValues.find(outputValue) != usedValues.end())
				{
					m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ", invocation " << localNdx
														   << ": found unexpected value " << outputValue
									   << TestLog::EndMessage;
					return false;
				}
				usedValues.insert(outputValue);
			}

			if (!de::inRange(groupOutput, 0, workGroupSize) || usedValues.find(groupOutput) != usedValues.end())
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ": unexpected final value" << groupOutput << TestLog::EndMessage;
				return false;
			}
		}

		return true;
	}